

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  byte bVar1;
  pointer tgt_00;
  bool bVar2;
  bool bVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar4;
  cmLocalGenerator *localGenerator;
  reference ppcVar5;
  pointer genexInterpreter_00;
  ostream *poVar6;
  pointer local_820;
  byte local_7db;
  byte local_7da;
  string local_7c8;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  string local_768;
  undefined1 local_748 [8];
  ostringstream e_2;
  string local_5d0;
  pair<bool,_bool> local_5aa;
  undefined1 local_5a8 [6];
  pair<bool,_bool> consistent_2;
  undefined1 local_588 [8];
  ostringstream e_1;
  string local_410;
  pair<bool,_bool> local_3ea;
  undefined1 local_3e8 [6];
  pair<bool,_bool> consistent_1;
  undefined1 local_3c8 [8];
  ostringstream e;
  string local_250;
  pair<bool,_bool> local_22a;
  undefined1 local_228 [6];
  pair<bool,_bool> consistent;
  undefined1 local_208 [8];
  string reportEntry;
  iterator iStack_1e0;
  bool ifacePropContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  byte local_1b9;
  undefined1 local_1b8 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  string local_178;
  byte local_151;
  string local_150;
  undefined1 local_129;
  cmGeneratorExpressionInterpreter *local_128;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_120;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string interfaceProperty;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  iterator iStack_98;
  bool impliedByUse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  byte local_61;
  undefined1 local_60 [7];
  bool explicitlySet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  bool propContent;
  bool *param_5_local;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       getTypedProperty<bool>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,tgt);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  local_70 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_78,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_80,p);
  iStack_98 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60);
  local_61 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff68);
  bVar2 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_7da = 1;
  if (bVar2 == (bool)(local_61 & 1)) {
    local_7db = 0;
    if (!bVar2) {
      local_7db = local_61 ^ 0xff;
    }
    local_7da = local_7db;
  }
  if ((local_7da & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar3) {
    report.field_2._12_4_ = 1;
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  }
  else {
    report.field_2._M_local_buf[0xb] = local_61 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0," * Target \"",&local_d1);
    std::allocator<char>::~allocator(&local_d1);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
    if ((local_61 & 1) == 0) {
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_d0,"\" has property content \"");
      valueAsString<bool>((string *)((long)&interfaceProperty.field_2 + 8),
                          (bool)(headPropKeys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::operator+=
                ((string *)local_d0,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_d0,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,"INTERFACE_",p);
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    local_129 = 0;
    local_151 = 0;
    if (bVar3) {
      local_820 = (pointer)operator_new(0x68);
      local_129 = 1;
      local_128 = local_820;
      localGenerator = cmGeneratorTarget::GetLocalGenerator(tgt);
      std::__cxx11::string::string((string *)&local_150,(string *)config);
      local_151 = 1;
      std::__cxx11::string::string((string *)&local_178);
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (local_820,localGenerator,&local_150,tgt,&local_178);
    }
    else {
      local_820 = (pointer)0x0;
    }
    local_129 = 0;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionInterpreter>,void>
              ((unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
                *)&local_120,local_820);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_178);
    }
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this);
    theTarget = (cmGeneratorTarget *)
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                end(this);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&theTarget), bVar3) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar5;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_1d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8);
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8);
      local_1c8 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_1d0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_1d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &genexInterpreter);
      iStack_1e0 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1b8);
      local_1b9 = __gnu_cxx::operator!=(&local_1c8,&stack0xfffffffffffffe20);
      tgt_00 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      genexInterpreter_00 =
           std::
           unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
           ::get(&local_120);
      reportEntry.field_2._M_local_buf[0xf] =
           getTypedProperty<bool>
                     ((cmGeneratorTarget *)tgt_00,(string *)&genexInterpreter,genexInterpreter_00);
      std::__cxx11::string::string((string *)local_208);
      if ((local_1b9 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_208," * Target \"");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_208,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_208,"\" property value \"");
        valueAsString<bool>((string *)local_228,(bool)(reportEntry.field_2._M_local_buf[0xf] & 1));
        std::__cxx11::string::operator+=((string *)local_208,(string *)local_228);
        std::__cxx11::string::~string((string *)local_228);
        std::__cxx11::string::operator+=((string *)local_208,"\" ");
      }
      if ((local_61 & 1) == 0) {
        if (bVar2) {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               impliedValue<bool>((bool)(headPropKeys.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ &
                                        1));
          if ((local_1b9 & 1) == 0) {
            report.field_2._12_4_ = 3;
          }
          else {
            local_3ea = consistentProperty<bool>
                                  ((bool)headPropKeys.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                   (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
            std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
            compatibilityAgree_abi_cxx11_
                      (&local_410,t,
                       (headPropKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                       (local_3ea.second & 1U));
            std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_410);
            std::__cxx11::string::~string((string *)&local_410);
            if (((ushort)local_3ea & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
              poVar6 = std::operator<<((ostream *)local_588,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,defaultValue);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  propKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Error((string *)local_5a8);
              std::__cxx11::string::~string((string *)local_5a8);
              report.field_2._12_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
            }
            else {
              headPropKeys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_3ea.second & 1;
              report.field_2._12_4_ = 3;
            }
          }
        }
        else if ((local_1b9 & 1) == 0) {
          report.field_2._12_4_ = 3;
        }
        else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_788,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_788);
          std::__cxx11::string::~string((string *)&local_788);
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               reportEntry.field_2._M_local_buf[0xf] & 1;
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          local_5aa = consistentProperty<bool>
                                ((bool)(headPropKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1
                                       ),(bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
          std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
          compatibilityAgree_abi_cxx11_
                    (&local_5d0,t,
                     (headPropKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                     (local_5aa.second & 1U));
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_5d0);
          std::__cxx11::string::~string((string *)&local_5d0);
          if (((ushort)local_5aa & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
            poVar6 = std::operator<<((ostream *)local_748,"The INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error(&local_768);
            std::__cxx11::string::~string((string *)&local_768);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_5aa.second & 1;
            report.field_2._12_4_ = 3;
          }
        }
      }
      else if ((local_1b9 & 1) == 0) {
        report.field_2._12_4_ = 3;
      }
      else {
        local_22a = consistentProperty<bool>
                              ((bool)(headPropKeys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                               (bool)(reportEntry.field_2._M_local_buf[0xf] & 1),t);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)local_208);
        compatibilityAgree_abi_cxx11_
                  (&local_250,t,
                   (headPropKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) !=
                   (local_22a.second & 1U));
        std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        if (((ushort)local_22a & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
          poVar6 = std::operator<<((ostream *)local_3c8,"Property ");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," on target \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          std::operator<<(poVar6,"\".\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error((string *)local_3e8);
          std::__cxx11::string::~string((string *)local_3e8);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
        }
        else {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_22a.second & 1;
          report.field_2._12_4_ = 3;
        }
      }
      std::__cxx11::string::~string((string *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    valueAsString<bool>(&local_7a8,
                        (bool)(headPropKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    compatibilityType_abi_cxx11_(&local_7c8,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_7a8,(string *)local_d0,&local_7c8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&local_7a8);
    bVar1 = headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    report.field_2._12_4_ = 1;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&local_120);
    std::__cxx11::string::~string((string *)&genexInterpreter);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}